

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

int Dar_LibEval_rec(Dar_LibObj_t *pObj,int Out,int nNodesSaved,int Required,float *pPower)

{
  float fVar1;
  float fVar2;
  Dar_LibObj_t DVar3;
  Dar_LibDat_t *pDVar4;
  Dar_Lib_t *pDVar5;
  int iVar6;
  int iVar7;
  undefined4 in_register_00000014;
  ulong uVar8;
  ulong uVar9;
  float *pfVar10;
  Dar_LibDat_t *pDVar11;
  float Power1;
  float Power0;
  float local_40;
  float local_3c;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,nNodesSaved);
  if (pPower != (float *)0x0) {
    *pPower = 0.0;
  }
  pDVar5 = s_DarLib;
  if (s_DarLib->pDatas[(ulong)*pObj >> 0x24].TravId != Out) {
    pDVar11 = s_DarLib->pDatas + ((ulong)*pObj >> 0x24);
    pDVar11->TravId = Out;
    DVar3 = *pObj;
    if (((ulong)DVar3 >> 0x23 & 1) == 0) {
      if ((ulong)DVar3 >> 0x26 == 0) {
        __assert_fail("pObj->Num > 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                      ,0x370,"int Dar_LibEval_rec(Dar_LibObj_t *, int, int, int, float *)");
      }
      if (Required < pDVar11->Level) {
        return 0xff;
      }
      if (((pDVar11->field_0).pFunc == (Aig_Obj_t *)0x0) || (pDVar11->fMffc != '\0')) {
        pfVar10 = &local_3c;
        if (pPower == (float *)0x0) {
          pfVar10 = (float *)0x0;
        }
        iVar6 = Dar_LibEval_rec((Dar_LibObj_t *)
                                (&pDVar5->pObjs->field_0x0 + ((DVar3._0_4_ & 0xffff) << 3)),Out,
                                nNodesSaved + -1,Required + 1,pfVar10);
        if ((int)local_38 <= iVar6) {
          return 0xff;
        }
        pfVar10 = &local_40;
        if (pPower == (float *)0x0) {
          pfVar10 = (float *)0x0;
        }
        iVar7 = Dar_LibEval_rec(s_DarLib->pObjs + *(ushort *)&pObj->field_0x2,Out,nNodesSaved + -1,
                                Required + 1,pfVar10);
        if ((int)local_38 <= iVar7 + iVar6) {
          return 0xff;
        }
        if (pPower != (float *)0x0) {
          pDVar4 = s_DarLib->pDatas;
          DVar3 = *pObj;
          uVar9 = (ulong)s_DarLib->pObjs[(ulong)DVar3 & 0xffff] >> 0x24;
          uVar8 = (ulong)s_DarLib->pObjs[(ulong)DVar3 >> 0x10 & 0xffff] >> 0x24;
          fVar1 = pDVar4[uVar9].dProb;
          if (((ulong)DVar3 >> 0x20 & 1) != 0) {
            fVar1 = 1.0 - fVar1;
          }
          fVar2 = pDVar4[uVar8].dProb;
          if (((ulong)DVar3 >> 0x21 & 1) != 0) {
            fVar2 = 1.0 - fVar2;
          }
          pDVar11->dProb = fVar1 * fVar2;
          fVar1 = pDVar4[uVar9].dProb;
          fVar2 = pDVar4[uVar8].dProb;
          *pPower = (fVar2 + fVar2) * (1.0 - fVar2) +
                    local_40 + (fVar1 + fVar1) * (1.0 - fVar1) + local_3c;
        }
        return iVar7 + iVar6 + 1;
      }
    }
    if (pPower != (float *)0x0) {
      *pPower = pDVar11->dProb;
    }
  }
  return 0;
}

Assistant:

int Dar_LibEval_rec( Dar_LibObj_t * pObj, int Out, int nNodesSaved, int Required, float * pPower )
{
    Dar_LibDat_t * pData;
    float Power0, Power1;
    int Area;
    if ( pPower )
        *pPower = (float)0.0;
    pData = s_DarLib->pDatas + pObj->Num;
    if ( pData->TravId == Out )
        return 0;
    pData->TravId = Out;
    if ( pObj->fTerm )
    {
        if ( pPower )
            *pPower = pData->dProb;
        return 0;
    }
    assert( pObj->Num > 3 );
    if ( pData->Level > Required )
        return 0xff;
    if ( pData->pFunc && !pData->fMffc )
    {
        if ( pPower )
            *pPower = pData->dProb;
        return 0;
    }
    // this is a new node - get a bound on the area of its branches
    nNodesSaved--;
    Area = Dar_LibEval_rec( Dar_LibObj(s_DarLib, pObj->Fan0), Out, nNodesSaved, Required+1, pPower? &Power0 : NULL );
    if ( Area > nNodesSaved )
        return 0xff;
    Area += Dar_LibEval_rec( Dar_LibObj(s_DarLib, pObj->Fan1), Out, nNodesSaved, Required+1, pPower? &Power1 : NULL );
    if ( Area > nNodesSaved )
        return 0xff;
    if ( pPower )
    {
        Dar_LibDat_t * pData0 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan0)->Num;
        Dar_LibDat_t * pData1 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan1)->Num;
        pData->dProb = (pObj->fCompl0? 1.0 - pData0->dProb : pData0->dProb)*
                       (pObj->fCompl1? 1.0 - pData1->dProb : pData1->dProb);
        *pPower = Power0 + 2.0 * pData0->dProb * (1.0 - pData0->dProb) +
                  Power1 + 2.0 * pData1->dProb * (1.0 - pData1->dProb);
    }
    return Area + 1;
}